

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

void process_extra(char *p,size_t extra_length,zip_entry *zip_entry)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (extra_length != 4) {
    uVar8 = 0;
    do {
      uVar2 = *(ushort *)(p + uVar8 + 2);
      uVar7 = (uint)uVar2;
      iVar4 = (int)uVar8;
      if (extra_length < iVar4 + (uint)uVar2 + 4) {
        return;
      }
      uVar9 = iVar4 + 4;
      uVar3 = *(ushort *)(p + uVar8);
      uVar10 = uVar7;
      if (uVar3 < 0x6c78) {
        if (uVar3 == 1) {
          zip_entry->flags = zip_entry->flags | 1;
          if (zip_entry->uncompressed_size == 0xffffffff) {
            if (uVar2 < 8) goto LAB_001653e5;
            zip_entry->uncompressed_size = *(int64_t *)(p + uVar9);
            uVar9 = iVar4 + 0xc;
            uVar7 = uVar7 - 8;
          }
          if (zip_entry->compressed_size == 0xffffffff) {
            uVar10 = uVar7;
            if ((ushort)uVar7 < 8) goto LAB_001653e5;
            zip_entry->compressed_size = *(int64_t *)(p + uVar9);
            uVar9 = uVar9 + 8;
            uVar7 = uVar7 - 8;
          }
          uVar10 = uVar7;
          if ((7 < (ushort)uVar7) && (zip_entry->local_header_offset == 0xffffffff)) {
            zip_entry->local_header_offset = *(int64_t *)(p + uVar9);
            uVar9 = uVar9 + 8;
            uVar10 = uVar7 - 8;
          }
        }
        else if (uVar3 == 0x5455) {
          bVar1 = p[uVar9];
          uVar9 = iVar4 + 5;
          uVar10 = uVar7 - 1;
          if ((bVar1 & 1) != 0) {
            if ((ushort)uVar10 < 4) goto LAB_001653e5;
            zip_entry->mtime = (ulong)*(uint *)(p + uVar9);
            uVar9 = iVar4 + 9;
            uVar10 = uVar7 - 5;
          }
          if ((bVar1 & 2) != 0) {
            if ((ushort)uVar10 < 4) goto LAB_001653e5;
            zip_entry->atime = (ulong)*(uint *)(p + uVar9);
            uVar9 = uVar9 + 4;
            uVar10 = uVar10 - 4;
          }
          if (((bVar1 & 4) != 0) && (3 < (ushort)uVar10)) {
            zip_entry->ctime = (ulong)*(uint *)(p + uVar9);
            uVar9 = uVar9 + 4;
            uVar10 = uVar10 - 4;
          }
        }
        else if ((uVar3 == 0x5855) && (7 < uVar2)) {
          zip_entry->atime = (ulong)*(uint *)(p + uVar9);
          zip_entry->mtime = (ulong)*(uint *)(p + (ulong)uVar9 + 4);
          if (0xb < uVar2) {
            zip_entry->uid = (ulong)*(ushort *)(p + (ulong)uVar9 + 8);
            uVar8 = (ulong)*(ushort *)(p + (ulong)uVar9 + 10);
            goto LAB_00165138;
          }
        }
      }
      else if (uVar3 < 0x7875) {
        if (uVar3 == 0x6c78) {
          if (uVar2 == 0) {
LAB_0016533a:
            uVar10 = 0;
          }
          else {
            bVar1 = p[uVar9];
            uVar9 = iVar4 + 5;
            uVar10 = uVar7 - 1;
            if (((char)bVar1 < '\0') && ((short)uVar10 != 0)) {
              do {
                uVar7 = uVar10;
                uVar8 = (ulong)uVar9;
                uVar9 = uVar9 + 1;
                uVar10 = uVar7 - 1;
                if (-1 < p[uVar8]) break;
              } while ((short)uVar7 != 1);
            }
            if ((bVar1 & 1) != 0) {
              if ((ushort)uVar7 < 3) goto LAB_001653e5;
              zip_entry->system = p[(ulong)uVar9 + 1];
              uVar9 = uVar9 + 2;
              uVar10 = uVar7 - 3;
            }
            if ((bVar1 & 2) != 0) {
              if ((ushort)uVar10 < 2) goto LAB_001653e5;
              uVar9 = uVar9 + 2;
              uVar10 = uVar10 - 2;
            }
            if ((bVar1 & 4) != 0) {
              if ((ushort)uVar10 < 4) goto LAB_001653e5;
              if (zip_entry->system == '\x03') {
                zip_entry->mode = *(uint16_t *)(p + (ulong)uVar9 + 2);
              }
              uVar9 = uVar9 + 4;
              uVar10 = uVar10 - 4;
            }
            if (((bVar1 & 8) != 0) && (1 < (ushort)uVar10)) {
              uVar2 = *(ushort *)(p + uVar9);
              uVar9 = uVar9 + 2;
              uVar10 = uVar10 - 2;
              if (uVar2 <= (ushort)uVar10) {
                uVar9 = uVar9 + uVar2;
                uVar10 = uVar10 - uVar2;
              }
            }
          }
        }
        else if ((uVar3 == 0x7855) && (1 < uVar2)) {
          zip_entry->uid = (ulong)*(ushort *)(p + uVar9);
          if (3 < uVar2) {
            uVar8 = (ulong)*(ushort *)(p + (ulong)uVar9 + 2);
            goto LAB_00165138;
          }
        }
      }
      else if (uVar3 == 0x7875) {
        if (uVar2 == 0) goto LAB_0016533a;
        uVar8 = (ulong)uVar9;
        if (p[uVar8] == '\x01') {
          uVar6 = 0;
          if (3 < uVar2) {
            bVar1 = p[iVar4 + 5];
            uVar6 = (ulong)bVar1;
            if (bVar1 == 2) {
              uVar11 = (ulong)*(ushort *)(p + uVar8 + 2);
              uVar6 = 2;
            }
            else {
              if ((uVar2 < 6) || (bVar1 != 4)) goto LAB_00165410;
              uVar11 = (ulong)*(uint *)(p + uVar8 + 2);
              uVar6 = 4;
            }
            zip_entry->uid = uVar11;
          }
LAB_00165410:
          iVar5 = (int)uVar6;
          if (iVar5 + 5U <= uVar7) {
            if (p[iVar4 + iVar5 + 6] == '\x04') {
              if (iVar5 + 7U <= uVar7) {
                uVar8 = (ulong)*(uint *)(p + uVar6 + uVar8 + 3);
                goto LAB_00165138;
              }
            }
            else if (p[iVar4 + iVar5 + 6] == '\x02') {
              uVar8 = (ulong)*(ushort *)(p + uVar6 + uVar8 + 3);
LAB_00165138:
              zip_entry->gid = uVar8;
            }
          }
        }
      }
      else if (((uVar3 == 0x9901) && (p[iVar4 + 6] == 'A')) && (p[iVar4 + 7] == 'E')) {
        (zip_entry->aes_extra).vendor = (uint)*(ushort *)(p + uVar9);
        (zip_entry->aes_extra).strength = (int)p[iVar4 + 8];
        (zip_entry->aes_extra).compression = p[iVar4 + 9];
      }
LAB_001653e5:
      uVar8 = (ulong)((uVar10 & 0xffff) + uVar9);
    } while (uVar8 < extra_length - 4);
  }
  return;
}

Assistant:

static void
process_extra(const char *p, size_t extra_length, struct zip_entry* zip_entry)
{
	unsigned offset = 0;

	while (offset < extra_length - 4) {
		unsigned short headerid = archive_le16dec(p + offset);
		unsigned short datasize = archive_le16dec(p + offset + 2);

		offset += 4;
		if (offset + datasize > extra_length)
			break;
#ifdef DEBUG
		fprintf(stderr, "Header id 0x%04x, length %d\n",
		    headerid, datasize);
#endif
		switch (headerid) {
		case 0x0001:
			/* Zip64 extended information extra field. */
			zip_entry->flags |= LA_USED_ZIP64;
			if (zip_entry->uncompressed_size == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->uncompressed_size =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->compressed_size == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->compressed_size =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->local_header_offset == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->local_header_offset =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			/* archive_le32dec(p + offset) gives disk
			 * on which file starts, but we don't handle
			 * multi-volume Zip files. */
			break;
#ifdef DEBUG
		case 0x0017:
		{
			/* Strong encryption field. */
			if (archive_le16dec(p + offset) == 2) {
				unsigned algId =
					archive_le16dec(p + offset + 2);
				unsigned bitLen =
					archive_le16dec(p + offset + 4);
				int	 flags =
					archive_le16dec(p + offset + 6);
				fprintf(stderr, "algId=0x%04x, bitLen=%u, "
				    "flgas=%d\n", algId, bitLen,flags);
			}
			break;
		}
#endif
		case 0x5455:
		{
			/* Extended time field "UT". */
			int flags = p[offset];
			offset++;
			datasize--;
			/* Flag bits indicate which dates are present. */
			if (flags & 0x01)
			{
#ifdef DEBUG
				fprintf(stderr, "mtime: %lld -> %d\n",
				    (long long)zip_entry->mtime,
				    archive_le32dec(p + offset));
#endif
				if (datasize < 4)
					break;
				zip_entry->mtime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x02)
			{
				if (datasize < 4)
					break;
				zip_entry->atime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x04)
			{
				if (datasize < 4)
					break;
				zip_entry->ctime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			break;
		}
		case 0x5855:
		{
			/* Info-ZIP Unix Extra Field (old version) "UX". */
			if (datasize >= 8) {
				zip_entry->atime = archive_le32dec(p + offset);
				zip_entry->mtime =
				    archive_le32dec(p + offset + 4);
			}
			if (datasize >= 12) {
				zip_entry->uid =
				    archive_le16dec(p + offset + 8);
				zip_entry->gid =
				    archive_le16dec(p + offset + 10);
			}
			break;
		}
		case 0x6c78:
		{
			/* Experimental 'xl' field */
			/*
			 * Introduced Dec 2013 to provide a way to
			 * include external file attributes (and other
			 * fields that ordinarily appear only in
			 * central directory) in local file header.
			 * This provides file type and permission
			 * information necessary to support full
			 * streaming extraction.  Currently being
			 * discussed with other Zip developers
			 * ... subject to change.
			 *
			 * Format:
			 *  The field starts with a bitmap that specifies
			 *  which additional fields are included.  The
			 *  bitmap is variable length and can be extended in
			 *  the future.
			 *
			 *  n bytes - feature bitmap: first byte has low-order
			 *    7 bits.  If high-order bit is set, a subsequent
			 *    byte holds the next 7 bits, etc.
			 *
			 *  if bitmap & 1, 2 byte "version made by"
			 *  if bitmap & 2, 2 byte "internal file attributes"
			 *  if bitmap & 4, 4 byte "external file attributes"
			 *  if bitmap * 7, 2 byte comment length + n byte comment
			 */
			int bitmap, bitmap_last;

			if (datasize < 1)
				break;
			bitmap_last = bitmap = 0xff & p[offset];
			offset += 1;
			datasize -= 1;

			/* We only support first 7 bits of bitmap; skip rest. */
			while ((bitmap_last & 0x80) != 0
			    && datasize >= 1) {
				bitmap_last = p[offset];
				offset += 1;
				datasize -= 1;
			}

			if (bitmap & 1) {
				/* 2 byte "version made by" */
				if (datasize < 2)
					break;
				zip_entry->system
				    = archive_le16dec(p + offset) >> 8;
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 2) {
				/* 2 byte "internal file attributes" */
				uint32_t internal_attributes;
				if (datasize < 2)
					break;
				internal_attributes
				    = archive_le16dec(p + offset);
				/* Not used by libarchive at present. */
				(void)internal_attributes; /* UNUSED */
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 4) {
				/* 4 byte "external file attributes" */
				uint32_t external_attributes;
				if (datasize < 4)
					break;
				external_attributes
				    = archive_le32dec(p + offset);
				if (zip_entry->system == 3) {
					zip_entry->mode
					    = external_attributes >> 16;
				}
				offset += 4;
				datasize -= 4;
			}
			if (bitmap & 8) {
				/* 2 byte comment length + comment */
				uint32_t comment_length;
				if (datasize < 2)
					break;
				comment_length
				    = archive_le16dec(p + offset);
				offset += 2;
				datasize -= 2;

				if (datasize < comment_length)
					break;
				/* Comment is not supported by libarchive */
				offset += comment_length;
				datasize -= comment_length;
			}
			break;
		}
		case 0x7855:
			/* Info-ZIP Unix Extra Field (type 2) "Ux". */
#ifdef DEBUG
			fprintf(stderr, "uid %d gid %d\n",
			    archive_le16dec(p + offset),
			    archive_le16dec(p + offset + 2));
#endif
			if (datasize >= 2)
				zip_entry->uid = archive_le16dec(p + offset);
			if (datasize >= 4)
				zip_entry->gid =
				    archive_le16dec(p + offset + 2);
			break;
		case 0x7875:
		{
			/* Info-Zip Unix Extra Field (type 3) "ux". */
			int uidsize = 0, gidsize = 0;

			/* TODO: support arbitrary uidsize/gidsize. */
			if (datasize >= 1 && p[offset] == 1) {/* version=1 */
				if (datasize >= 4) {
					/* get a uid size. */
					uidsize = 0xff & (int)p[offset+1];
					if (uidsize == 2)
						zip_entry->uid =
						    archive_le16dec(
						        p + offset + 2);
					else if (uidsize == 4 && datasize >= 6)
						zip_entry->uid =
						    archive_le32dec(
						        p + offset + 2);
				}
				if (datasize >= (2 + uidsize + 3)) {
					/* get a gid size. */
					gidsize = 0xff & (int)p[offset+2+uidsize];
					if (gidsize == 2)
						zip_entry->gid =
						    archive_le16dec(
						        p+offset+2+uidsize+1);
					else if (gidsize == 4 &&
					    datasize >= (2 + uidsize + 5))
						zip_entry->gid =
						    archive_le32dec(
						        p+offset+2+uidsize+1);
				}
			}
			break;
		}
		case 0x9901:
			/* WinZIp AES extra data field. */
			if (p[offset + 2] == 'A' && p[offset + 3] == 'E') {
				/* Vendor version. */
				zip_entry->aes_extra.vendor =
				    archive_le16dec(p + offset);
				/* AES encryption strength. */
				zip_entry->aes_extra.strength = p[offset + 4];
				/* Actual compression method. */
				zip_entry->aes_extra.compression =
				    p[offset + 5];
			}
			break;
		default:
			break;
		}
		offset += datasize;
	}
#ifdef DEBUG
	if (offset != extra_length)
	{
		fprintf(stderr,
		    "Extra data field contents do not match reported size!\n");
	}
#endif
}